

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

ssize_t __thiscall Directory::read(Directory *this,int __fd,void *__buf,size_t __nbytes)

{
  usize uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *__pattern;
  dirent *pdVar5;
  size_t sVar6;
  char *__file;
  int *extraout_RAX;
  undefined4 in_register_00000034;
  String local_138;
  int local_10c;
  undefined1 local_108 [8];
  stat buff;
  undefined1 local_68 [8];
  String path;
  char *str;
  dirent *dent;
  char *pattern;
  bool *isDir_local;
  String *name_local;
  Directory *this_local;
  
  if (this->dp != (void *)0x0) {
    __pattern = String::operator_cast_to_char_(&this->pattern);
    piVar4 = __errno_location();
    *piVar4 = 0;
LAB_0011fdac:
    do {
      pdVar5 = readdir((DIR *)this->dp);
      if (pdVar5 == (dirent *)0x0) {
        this_local._7_1_ = 0;
        piVar4 = (int *)0x0;
        goto LAB_00120018;
      }
      path._data.ref = (usize)pdVar5->d_name;
    } while (((*__pattern != '\0') &&
             (iVar3 = fnmatch(__pattern,(char *)path._data.ref,0), iVar3 != 0)) ||
            ((*(bool *)__buf = pdVar5->d_type == '\x04', (this->dirsOnly & 1U) != 0 &&
             ((*__buf & 1) == 0))));
    if (((*__buf & 1) == 0) && ((pdVar5->d_type == '\n' || (pdVar5->d_type == '\0')))) {
      String::String((String *)local_68,&this->dirpath);
      bVar2 = String::isEmpty(&this->dirpath);
      if (!bVar2) {
        String::append((String *)local_68,'/');
      }
      uVar1 = path._data.ref;
      sVar6 = strlen((char *)path._data.ref);
      String::append((String *)local_68,(char *)uVar1,sVar6);
      __file = String::operator_cast_to_char_((String *)local_68);
      iVar3 = stat(__file,(stat *)local_108);
      if ((iVar3 == 0) && (((uint)buff.st_nlink & 0xf000) == 0x4000)) {
        *(undefined1 *)__buf = 1;
LAB_0011ff3d:
        local_10c = 0;
      }
      else {
        if ((this->dirsOnly & 1U) == 0) goto LAB_0011ff3d;
        local_10c = 3;
      }
      String::~String((String *)local_68);
      if (local_10c != 0) goto LAB_0011fdac;
    }
    uVar1 = path._data.ref;
    if ((((*__buf & 1) == 0) || (*(char *)path._data.ref != '.')) ||
       ((*(char *)(path._data.ref + 1) != '\0' &&
        ((*(char *)(path._data.ref + 1) != '.' || (*(char *)(path._data.ref + 2) != '\0'))))))
    goto LAB_0011ffa4;
    goto LAB_0011fdac;
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  this_local._7_1_ = 0;
LAB_00120018:
  return CONCAT71((int7)((ulong)piVar4 >> 8),this_local._7_1_);
LAB_0011ffa4:
  sVar6 = strlen((char *)path._data.ref);
  String::String(&local_138,(char *)uVar1,sVar6);
  String::operator=((String *)CONCAT44(in_register_00000034,__fd),&local_138);
  String::~String(&local_138);
  this_local._7_1_ = 1;
  piVar4 = extraout_RAX;
  goto LAB_00120018;
}

Assistant:

bool Directory::read(String& name, bool& isDir)
{
#ifdef _WIN32
  if(!findFile)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  for(;;)
  {
    if(bufferedEntry)
      bufferedEntry = false;
    else if(!FindNextFile((HANDLE)findFile, (LPWIN32_FIND_DATA)ffd))
    {
      DWORD lastError = GetLastError();
      FindClose((HANDLE)findFile);
      findFile = INVALID_HANDLE_VALUE;
      SetLastError(lastError);
      return false;
    }
    isDir = (((LPWIN32_FIND_DATA)ffd)->dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) == FILE_ATTRIBUTE_DIRECTORY;
    if(dirsOnly && !isDir)
      continue;
    const char* str = ((LPWIN32_FIND_DATA)ffd)->cFileName;
    if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
      continue;

    if(!pattern.isEmpty())
    {
      struct PatternMatcher
      {
        static bool szWildMatch7(const char* pat, const char* str) {
            const char* s, * p;
            bool star = false;

        loopStart:
            for (s = str, p = pat; *s; ++s, ++p) {
              switch (*p) {
                  case '?':
                    break;
                  case '*':
                    star = true;
                    str = s, pat = p;
                    do { ++pat; } while (*pat == '*');
                    if (!*pat) return true;
                    goto loopStart;
                  default:
                    if (String::toLowerCase(*s) != String::toLowerCase(*p)) goto starCheck;
                    break;
              }
            }
            while (*p == '*') ++p;
            return !*p;
   
        starCheck:
            if (!star) return false;
            str++;
            goto loopStart;
        }
      };

      if(!PatternMatcher::szWildMatch7(pattern, str))
        continue;
    }

    name = String(str, (uint)strlen(str));
    return true;
  }
#else
  if(!dp)
  {
    errno = EINVAL;
    return false;
  }

  const char* pattern = this->pattern;
  errno = 0;
  for(;;)
  {
    struct dirent* dent = readdir((DIR*)dp);
    if(!dent)
      break;
    const char* const str = dent->d_name;
    if(!*pattern || fnmatch(pattern, str, 0) == 0)
    {
      isDir = dent->d_type == DT_DIR;
      if(dirsOnly && !isDir)
        continue;
      if(!isDir && (dent->d_type == DT_LNK || dent->d_type == DT_UNKNOWN))
      {
        String path = dirpath;
        if(!dirpath.isEmpty())
          path.append('/');
        path.append(str, strlen(str));
        struct stat buff;
        if(stat(path, &buff) == 0 && S_ISDIR(buff.st_mode))
          isDir = true;
        else if(dirsOnly)
          continue;
      }
      if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
        continue;
      name = String(str, strlen(str));
      return true;
    }
  }
  return false;
#endif
}